

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O3

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,VariableRead *e)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  Block *pBVar4;
  RuntimeException *this_00;
  long *plVar5;
  size_type *psVar6;
  string field_name;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  pBVar4 = (e->super_Expression).super_Statement.super_ASTElement.parent;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar3 = parser::element::VariableRead::get_name_abi_cxx11_(e);
  pBVar4 = navigate_object_tree(pBVar4,psVar3,&local_90);
  pBVar4 = parser::element::Block::get_variable(pBVar4,&local_90);
  if (pBVar4 != (Block *)0x0) {
    (*(pBVar4->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[5])
              (pBVar4,(e->super_Expression).super_Statement.super_ASTElement.parent);
    (*(pBVar4->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[2])(pBVar4,this);
    bVar1 = parser::element::Block::is_echoing
                      ((e->super_Expression).super_Statement.super_ASTElement.parent);
    if ((bVar1) && (is_echoing_disabled == false)) {
      pBVar4 = (e->super_Expression).super_Statement.super_ASTElement.parent;
      iVar2 = parser::element::VariableRead::get_trailing_spaces(e);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_b0,(char)iVar2);
      parser::element::Block::__add_output_segment(pBVar4,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x38);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"TODO","");
  psVar3 = parser::element::VariableRead::get_name_abi_cxx11_(e);
  std::operator+(&local_50,"Variable \"",psVar3);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70.field_2._8_8_ = plVar5[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar6;
  }
  local_70._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  exception::RuntimeException::RuntimeException(this_00,0,&local_b0,&local_70);
  __cxa_throw(this_00,&exception::RuntimeException::typeinfo,
              exception::RuntimeException::~RuntimeException);
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::VariableRead *e) {
    // Obtain the referenced object by navigating the name structure
    std::string field_name;
    auto target_object { navigate_object_tree(e->get_parent(), e->get_name(), field_name) };

    auto variable {target_object->get_variable(field_name)};

    if (!variable) {
        // TODO: add information of line number and origin
        throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Variable \""+e->get_name()+"\" has not been declared!");
    }

    variable->__set_output_block(e->get_parent());
    variable->accept(this);

    // Recover the trailing spaces
    if (e->get_parent()->is_echoing() && !is_echoing_disabled) {
        e->get_parent()->__add_output_segment(std::string(e->get_trailing_spaces(), ' '));
    }
}